

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForAnyEvent(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  int i;
  pollfd fds [3];
  nfds_t in_stack_00000030;
  pollfd *in_stack_00000038;
  uint local_2c;
  ushort local_22;
  int local_20;
  undefined2 local_1c;
  undefined2 local_1a;
  int local_18;
  undefined2 local_14;
  undefined2 local_12;
  
  local_22 = 0;
  local_20 = _glfw.x11.emptyEventPipe[0];
  local_1c = 1;
  local_1a = 0;
  local_18 = -1;
  local_14 = 1;
  local_12 = 0;
  if (_glfw.joysticksInitialized != 0) {
    local_18 = _glfw.linjs.inotify;
  }
  while( true ) {
    iVar1 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = _glfwPollPOSIX(in_stack_00000038,in_stack_00000030,timeout);
    if (GVar2 == 0) break;
    for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
      if (((&local_22)[(long)(int)local_2c * 4] & 1) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    enum { XLIB_FD, PIPE_FD, INOTIFY_FD };
    struct pollfd fds[] =
    {
        [XLIB_FD] = { ConnectionNumber(_glfw.x11.display), POLLIN },
        [PIPE_FD] = { _glfw.x11.emptyEventPipe[0], POLLIN },
        [INOTIFY_FD] = { -1, POLLIN }
    };

#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        fds[INOTIFY_FD].fd = _glfw.linjs.inotify;
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
            return GLFW_FALSE;

        for (int i = 1; i < sizeof(fds) / sizeof(fds[0]); i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}